

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter.cpp
# Opt level: O1

bool __thiscall
Assimp::AMFImporter::Find_ConvertedMaterial
          (AMFImporter *this,string *pID,SPP_Material **pConvertedMaterial)

{
  _List_node_base *p_Var1;
  _List_node_base *__n;
  bool bVar2;
  int iVar3;
  bool bVar4;
  
  p_Var1 = (this->mMaterial_Converted).
           super__List_base<Assimp::AMFImporter::SPP_Material,_std::allocator<Assimp::AMFImporter::SPP_Material>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  do {
    bVar2 = p_Var1 != (_List_node_base *)&this->mMaterial_Converted;
    if (!bVar2) {
      return bVar2;
    }
    __n = p_Var1[1]._M_prev;
    if (__n == (_List_node_base *)pID->_M_string_length) {
      if (__n == (_List_node_base *)0x0) {
        bVar4 = true;
      }
      else {
        iVar3 = bcmp((((SPP_Material *)(p_Var1 + 1))->ID)._M_dataplus._M_p,(pID->_M_dataplus)._M_p,
                     (size_t)__n);
        bVar4 = iVar3 == 0;
      }
    }
    else {
      bVar4 = false;
    }
    if (bVar4) {
      if (pConvertedMaterial != (SPP_Material **)0x0) {
        *pConvertedMaterial = (SPP_Material *)(p_Var1 + 1);
      }
      if (bVar4) {
        return bVar2;
      }
    }
    p_Var1 = p_Var1->_M_next;
  } while( true );
}

Assistant:

bool AMFImporter::Find_ConvertedMaterial(const std::string& pID, const SPP_Material** pConvertedMaterial) const
{
	for(const SPP_Material& mat: mMaterial_Converted)
	{
		if(mat.ID == pID)
		{
			if(pConvertedMaterial != nullptr) *pConvertedMaterial = &mat;

			return true;
		}
	}// for(const SPP_Material& mat: mMaterial_Converted)

	return false;
}